

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_resp_make(http_resp **presp,int status,char *description)

{
  char *pcVar1;
  http_resp *local_38;
  CURLcode local_2c;
  CURLcode result;
  http_resp *resp;
  char *description_local;
  int status_local;
  http_resp **presp_local;
  
  local_2c = CURLE_OUT_OF_MEMORY;
  local_38 = (http_resp *)(*Curl_ccalloc)(1,0x88);
  if (local_38 != (http_resp *)0x0) {
    local_38->status = status;
    if (description != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(description);
      local_38->description = pcVar1;
      if (local_38->description == (char *)0x0) goto LAB_00b300a7;
    }
    Curl_dynhds_init(&local_38->headers,0,0x100000);
    Curl_dynhds_init(&local_38->trailers,0,0x100000);
    local_2c = CURLE_OK;
  }
LAB_00b300a7:
  if ((local_2c != CURLE_OK) && (local_38 != (http_resp *)0x0)) {
    Curl_http_resp_free(local_38);
  }
  if (local_2c != CURLE_OK) {
    local_38 = (http_resp *)0x0;
  }
  *presp = local_38;
  return local_2c;
}

Assistant:

CURLcode Curl_http_resp_make(struct http_resp **presp,
                             int status,
                             const char *description)
{
  struct http_resp *resp;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  resp = calloc(1, sizeof(*resp));
  if(!resp)
    goto out;

  resp->status = status;
  if(description) {
    resp->description = strdup(description);
    if(!resp->description)
      goto out;
  }
  Curl_dynhds_init(&resp->headers, 0, DYN_HTTP_REQUEST);
  Curl_dynhds_init(&resp->trailers, 0, DYN_HTTP_REQUEST);
  result = CURLE_OK;

out:
  if(result && resp)
    Curl_http_resp_free(resp);
  *presp = result? NULL : resp;
  return result;
}